

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O0

int Cudd_DebugCheck(DdManager *table)

{
  uint uVar1;
  int iVar2;
  st__table *table_00;
  st__generator *gen_00;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_5c;
  int index;
  int deadNode;
  int totalNode;
  int flag;
  st__generator *gen;
  st__table *edgeTable;
  DdNode *sentinel;
  DdNode *f;
  DdNodePtr *nodelist;
  int slots;
  int count;
  int j;
  uint i;
  DdManager *table_local;
  
  deadNode = 0;
  _j = table;
  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
  if (table_00 == (st__table *)0x0) {
    table_local._4_4_ = -1;
  }
  else {
    for (count = 0; (uint)count < (uint)_j->size; count = count + 1) {
      uVar1 = _j->invperm[(uint)count];
      if (count != _j->perm[(int)uVar1]) {
        fprintf((FILE *)_j->err,"Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                (ulong)(uint)count,(ulong)uVar1,(ulong)uVar1,(ulong)(uint)_j->perm[(int)uVar1]);
      }
      f = (DdNode *)_j->subtables[(uint)count].nodelist;
      nodelist._0_4_ = _j->subtables[(uint)count].slots;
      index = 0;
      local_5c = 0;
      for (slots = 0; slots < (int)(uint)nodelist; slots = slots + 1) {
        for (sentinel = *(DdNode **)(&f->index + (long)slots * 2); (DdManager *)sentinel != table;
            sentinel = sentinel->next) {
          index = index + 1;
          if ((((sentinel->type).kids.T == (DdNode *)0x0) ||
              ((sentinel->type).kids.E == (DdNode *)0x0)) || (sentinel->ref == 0)) {
            if ((((sentinel->type).kids.T == (DdNode *)0x0) ||
                ((sentinel->type).kids.E == (DdNode *)0x0)) || (sentinel->ref != 0)) {
              fprintf((FILE *)_j->err,"Error: node has illegal Then or Else pointers\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            else {
              local_5c = local_5c + 1;
            }
          }
          else {
            if (sentinel->index != uVar1) {
              fprintf((FILE *)_j->err,"Error: node has illegal index\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            if (((sentinel->type).kids.T)->index == 0x7fffffff) {
              local_64 = ((sentinel->type).kids.T)->index;
            }
            else {
              local_64 = _j->perm[((sentinel->type).kids.T)->index];
            }
            if ((uint)count < local_64) {
              if (*(int *)((ulong)(sentinel->type).kids.E & 0xfffffffffffffffe) == 0x7fffffff) {
                local_68 = *(uint *)((ulong)(sentinel->type).kids.E & 0xfffffffffffffffe);
              }
              else {
                local_68 = _j->perm[*(uint *)((ulong)(sentinel->type).kids.E & 0xfffffffffffffffe)];
              }
              if (local_68 <= (uint)count) goto LAB_009f462d;
            }
            else {
LAB_009f462d:
              fprintf((FILE *)_j->err,"Error: node has illegal children\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            if ((DdNode *)((ulong)(sentinel->type).kids.T & 0xfffffffffffffffe) !=
                (sentinel->type).kids.T) {
              fprintf((FILE *)_j->err,"Error: node has illegal form\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            if ((sentinel->type).kids.T == (sentinel->type).kids.E) {
              fprintf((FILE *)_j->err,"Error: node has identical children\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            if ((((sentinel->type).kids.T)->ref == 0) ||
               (*(int *)(((ulong)(sentinel->type).kids.E & 0xfffffffffffffffe) + 4) == 0)) {
              fprintf((FILE *)_j->err,"Error: live node has dead children\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            iVar2 = st__lookup_int(table_00,(char *)(sentinel->type).kids.T,
                                   (int *)((long)&nodelist + 4));
            if (iVar2 == 0) {
              nodelist._4_4_ = 1;
            }
            else {
              nodelist._4_4_ = nodelist._4_4_ + 1;
            }
            iVar2 = st__insert(table_00,(char *)(sentinel->type).kids.T,
                               (char *)(long)(int)nodelist._4_4_);
            if (iVar2 == -10000) {
              st__free_table(table_00);
              return -1;
            }
            iVar2 = st__lookup_int(table_00,(char *)((ulong)(sentinel->type).kids.E &
                                                    0xfffffffffffffffe),(int *)((long)&nodelist + 4)
                                  );
            if (iVar2 == 0) {
              nodelist._4_4_ = 1;
            }
            else {
              nodelist._4_4_ = nodelist._4_4_ + 1;
            }
            iVar2 = st__insert(table_00,(char *)((ulong)(sentinel->type).kids.E & 0xfffffffffffffffe
                                                ),(char *)(long)(int)nodelist._4_4_);
            if (iVar2 == -10000) {
              st__free_table(table_00);
              return -1;
            }
          }
        }
      }
      if (index != _j->subtables[(uint)count].keys) {
        fprintf((FILE *)_j->err,"Error: wrong number of total nodes\n");
        deadNode = 1;
      }
      if (local_5c != _j->subtables[(uint)count].dead) {
        fprintf((FILE *)_j->err,"Error: wrong number of dead nodes\n");
        deadNode = 1;
      }
    }
    for (count = 0; (uint)count < (uint)_j->sizeZ; count = count + 1) {
      uVar1 = _j->invpermZ[(uint)count];
      if (count != _j->permZ[(int)uVar1]) {
        fprintf((FILE *)_j->err,"Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n"
                ,(ulong)(uint)count,(ulong)uVar1,(ulong)uVar1,(ulong)(uint)_j->permZ[(int)uVar1]);
      }
      f = (DdNode *)_j->subtableZ[(uint)count].nodelist;
      nodelist._0_4_ = _j->subtableZ[(uint)count].slots;
      index = 0;
      local_5c = 0;
      for (slots = 0; slots < (int)(uint)nodelist; slots = slots + 1) {
        for (sentinel = *(DdNode **)(&f->index + (long)slots * 2); sentinel != (DdNode *)0x0;
            sentinel = sentinel->next) {
          index = index + 1;
          if ((((sentinel->type).kids.T == (DdNode *)0x0) ||
              ((sentinel->type).kids.E == (DdNode *)0x0)) || (sentinel->ref == 0)) {
            if ((((sentinel->type).kids.T == (DdNode *)0x0) ||
                ((sentinel->type).kids.E == (DdNode *)0x0)) || (sentinel->ref != 0)) {
              fprintf((FILE *)_j->err,"Error: ZDD node has illegal Then or Else pointers\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            else {
              local_5c = local_5c + 1;
            }
          }
          else {
            if (sentinel->index != uVar1) {
              fprintf((FILE *)_j->err,"Error: ZDD node has illegal index\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            if ((((ulong)(sentinel->type).kids.T & 1) != 0) ||
               (((ulong)(sentinel->type).kids.E & 1) != 0)) {
              fprintf((FILE *)_j->err,"Error: ZDD node has complemented children\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            if (((sentinel->type).kids.T)->index == 0x7fffffff) {
              local_6c = ((sentinel->type).kids.T)->index;
            }
            else {
              local_6c = _j->permZ[((sentinel->type).kids.T)->index];
            }
            if ((uint)count < local_6c) {
              if (((sentinel->type).kids.E)->index == 0x7fffffff) {
                local_70 = ((sentinel->type).kids.E)->index;
              }
              else {
                local_70 = _j->permZ[((sentinel->type).kids.E)->index];
              }
              if (local_70 <= (uint)count) goto LAB_009f4b51;
            }
            else {
LAB_009f4b51:
              fprintf((FILE *)_j->err,"Error: ZDD node has illegal children\n");
              cuddPrintNode(sentinel,_j->err);
              cuddPrintNode((sentinel->type).kids.T,_j->err);
              cuddPrintNode((sentinel->type).kids.E,_j->err);
              deadNode = 1;
            }
            if ((sentinel->type).kids.T == _j->zero) {
              fprintf((FILE *)_j->err,"Error: ZDD node has zero then child\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            if ((((sentinel->type).kids.T)->ref == 0) || (((sentinel->type).kids.E)->ref == 0)) {
              fprintf((FILE *)_j->err,"Error: ZDD live node has dead children\n");
              cuddPrintNode(sentinel,_j->err);
              deadNode = 1;
            }
            iVar2 = st__lookup_int(table_00,(char *)(sentinel->type).kids.T,
                                   (int *)((long)&nodelist + 4));
            if (iVar2 == 0) {
              nodelist._4_4_ = 1;
            }
            else {
              nodelist._4_4_ = nodelist._4_4_ + 1;
            }
            iVar2 = st__insert(table_00,(char *)(sentinel->type).kids.T,
                               (char *)(long)(int)nodelist._4_4_);
            if (iVar2 == -10000) {
              st__free_table(table_00);
              return -1;
            }
            iVar2 = st__lookup_int(table_00,(char *)(sentinel->type).kids.E,
                                   (int *)((long)&nodelist + 4));
            if (iVar2 == 0) {
              nodelist._4_4_ = 1;
            }
            else {
              nodelist._4_4_ = nodelist._4_4_ + 1;
            }
            iVar2 = st__insert(table_00,(char *)(sentinel->type).kids.E,
                               (char *)(long)(int)nodelist._4_4_);
            if (iVar2 == -10000) {
              st__free_table(table_00);
              _j->errorCode = CUDD_MEMORY_OUT;
              return -1;
            }
          }
        }
      }
      if (index != _j->subtableZ[(uint)count].keys) {
        fprintf((FILE *)_j->err,"Error: wrong number of total nodes in ZDD\n");
        deadNode = 1;
      }
      if (local_5c != _j->subtableZ[(uint)count].dead) {
        fprintf((FILE *)_j->err,"Error: wrong number of dead nodes in ZDD\n");
        deadNode = 1;
      }
    }
    f = (DdNode *)(_j->constants).nodelist;
    nodelist._0_4_ = (_j->constants).slots;
    index = 0;
    local_5c = 0;
    for (slots = 0; slots < (int)(uint)nodelist; slots = slots + 1) {
      for (sentinel = *(DdNode **)(&f->index + (long)slots * 2); sentinel != (DdNode *)0x0;
          sentinel = sentinel->next) {
        index = index + 1;
        if (sentinel->ref == 0) {
          local_5c = local_5c + 1;
        }
        else if (sentinel->index != 0x7fffffff) {
          fprintf((FILE *)_j->err,"Error: node has illegal index\n");
          fprintf((FILE *)_j->err,"       node 0x%lx, id = %u, ref = %u, value = %g\n",
                  (sentinel->type).value,sentinel,(ulong)sentinel->index,(ulong)sentinel->ref);
          deadNode = 1;
        }
      }
    }
    if (index != (_j->constants).keys) {
      fprintf((FILE *)_j->err,"Error: wrong number of total nodes in constants\n");
      deadNode = 1;
    }
    if (local_5c != (_j->constants).dead) {
      fprintf((FILE *)_j->err,"Error: wrong number of dead nodes in constants\n");
      deadNode = 1;
    }
    gen_00 = st__init_gen(table_00);
    while (iVar2 = st__gen(gen_00,(char **)&sentinel,(char **)((long)&nodelist + 4)), iVar2 != 0) {
      if (((int)sentinel->ref < (int)nodelist._4_4_) && (sentinel->ref != 0xffffffff)) {
        fprintf((FILE *)_j->err,
                "ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n"
                ,sentinel,(ulong)nodelist._4_4_,(ulong)sentinel->index,(ulong)sentinel->ref,
                (sentinel->type).value,(sentinel->type).kids.E);
        debugFindParent(_j,sentinel);
        deadNode = 1;
      }
    }
    st__free_gen(gen_00);
    st__free_table(table_00);
    table_local._4_4_ = deadNode;
  }
  return table_local._4_4_;
}

Assistant:

int
Cudd_DebugCheck(
  DdManager * table)
{
    unsigned int i;
    int         j,count;
    int         slots;
    DdNodePtr   *nodelist;
    DdNode      *f;
    DdNode      *sentinel = &(table->sentinel);
    st__table    *edgeTable;     /* stores internal ref count for each node */
    st__generator        *gen;
    int         flag = 0;
    int         totalNode;
    int         deadNode;
    int         index;


    edgeTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (edgeTable == NULL) return(CUDD_OUT_OF_MEM);

    /* Check the BDD/ADD subtables. */
    for (i = 0; i < (unsigned) table->size; i++) {
        index = table->invperm[i];
        if (i != (unsigned) table->perm[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                           i, index, index, table->perm[index]);
        }
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != sentinel) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddI(table,cuddT(f)->index) <= i ||
                        (unsigned) cuddI(table,Cudd_Regular(cuddE(f))->index)
                        <= i) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_Regular(cuddT(f)) != cuddT(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal form\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == cuddE(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has identical children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || Cudd_Regular(cuddE(f))->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                                      &count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtables[i].keys) {
            fprintf(table->err,"Error: wrong number of total nodes\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtables[i].dead) {
            fprintf(table->err,"Error: wrong number of dead nodes\n");
            flag = 1;
        }
    }   /* for each BDD/ADD subtable */

    /* Check the ZDD subtables. */
    for (i = 0; i < (unsigned) table->sizeZ; i++) {
        index = table->invpermZ[i];
        if (i != (unsigned) table->permZ[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n",
                           i, index, index, table->permZ[index]);
        }
        nodelist = table->subtableZ[i].nodelist;
        slots = table->subtableZ[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != NULL) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_IsComplement(cuddT(f)) ||
                        Cudd_IsComplement(cuddE(f))) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has complemented children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddIZ(table,cuddT(f)->index) <= i ||
                    (unsigned) cuddIZ(table,cuddE(f)->index) <= i) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        cuddPrintNode(cuddT(f),table->err);
                        cuddPrintNode(cuddE(f),table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == DD_ZERO(table)) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has zero then child\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || cuddE(f)->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: ZDD live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddE(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddE(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        table->errorCode = CUDD_MEMORY_OUT;
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: ZDD node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtableZ[i].keys) {
            fprintf(table->err,
                    "Error: wrong number of total nodes in ZDD\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtableZ[i].dead) {
            fprintf(table->err,
                    "Error: wrong number of dead nodes in ZDD\n");
            flag = 1;
        }
    }   /* for each ZDD subtable */

    /* Check the constant table. */
    nodelist = table->constants.nodelist;
    slots = table->constants.slots;

    totalNode = 0;
    deadNode = 0;
    for (j = 0; j < slots; j++) {
        f = nodelist[j];
        while (f != NULL) {
            totalNode++;
            if (f->ref != 0) {
                if (f->index != CUDD_CONST_INDEX) {
                    fprintf(table->err,"Error: node has illegal index\n");
#if SIZEOF_VOID_P == 8
                    fprintf(table->err,
                            "       node 0x%lx, id = %u, ref = %u, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#else
                    fprintf(table->err,
                            "       node 0x%x, id = %hu, ref = %hu, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#endif
                    flag = 1;
                }
            } else {
                deadNode++;
            }
            f = f->next;
        }
    }
    if ((unsigned) totalNode != table->constants.keys) {
        (void) fprintf(table->err,
                       "Error: wrong number of total nodes in constants\n");
        flag = 1;
    }
    if ((unsigned) deadNode != table->constants.dead) {
        (void) fprintf(table->err,
                       "Error: wrong number of dead nodes in constants\n");
        flag = 1;
    }
    gen = st__init_gen(edgeTable);
    while ( st__gen(gen, (const char **)&f, (char **)&count)) {
        if (count > (int)(f->ref) && f->ref != DD_MAXREF) {
#if SIZEOF_VOID_P == 8
            fprintf(table->err,"ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
            fprintf(table->err,"ref count error at node 0x%x, count = %d, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif
            debugFindParent(table,f);
            flag = 1;
        }
    }
    st__free_gen(gen);
    st__free_table(edgeTable);

    return (flag);

}